

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImTriangulator::FlipNodeList(ImTriangulator *this)

{
  ImTriangulatorNode *pIVar1;
  ImTriangulatorNode *current;
  ImTriangulatorNode *temp;
  ImTriangulatorNode *prev;
  ImTriangulator *this_local;
  
  prev = this->_Nodes;
  current = this->_Nodes->Next;
  prev->Next = prev;
  prev->Prev = prev;
  while (current != this->_Nodes) {
    pIVar1 = current->Next;
    current->Next = prev;
    prev->Prev = current;
    this->_Nodes->Next = current;
    current->Prev = this->_Nodes;
    prev = current;
    current = pIVar1;
  }
  this->_Nodes = prev;
  return;
}

Assistant:

void ImTriangulator::FlipNodeList()
{
    ImTriangulatorNode* prev = _Nodes;
    ImTriangulatorNode* temp = _Nodes;
    ImTriangulatorNode* current = _Nodes->Next;
    prev->Next = prev;
    prev->Prev = prev;
    while (current != _Nodes)
    {
        temp = current->Next;

        current->Next = prev;
        prev->Prev = current;
        _Nodes->Next = current;
        current->Prev = _Nodes;

        prev = current;
        current = temp;
    }
    _Nodes = prev;
}